

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_double_nonfinite(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *unaff_R14;
  char *unaff_R15;
  size_t len;
  undefined1 local_20 [8];
  
  uVar3 = bson_new();
  cVar1 = bson_append_double(0x7ff8000000000000,uVar3,"nan",0xffffffff);
  if (cVar1 == '\0') {
    test_bson_as_json_double_nonfinite_cold_1();
LAB_0012d2d6:
    test_bson_as_json_double_nonfinite_cold_2();
  }
  else {
    cVar1 = bson_append_double(0x7ff0000000000000,uVar3,"pos_inf",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d2d6;
    cVar1 = bson_append_double(0xfff0000000000000,uVar3,"neg_inf",0xffffffff);
    if (cVar1 != '\0') {
      unaff_R14 = (char *)bson_as_json(uVar3,local_20);
      unaff_R15 = (char *)bson_strdup_printf(0x7ff8000000000000,0x7ff0000000000000,
                                             0xfff0000000000000,
                                             "{ \"nan\" : %.20g, \"pos_inf\" : %.20g, \"neg_inf\" : %.20g }"
                                            );
      if (unaff_R14 == unaff_R15) {
LAB_0012d2af:
        bson_free(unaff_R15);
        bson_free(unaff_R14);
        bson_destroy(uVar3);
        return;
      }
      iVar2 = strcmp(unaff_R14,unaff_R15);
      if (iVar2 == 0) goto LAB_0012d2af;
      goto LAB_0012d2e0;
    }
  }
  test_bson_as_json_double_nonfinite_cold_3();
LAB_0012d2e0:
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",unaff_R14,unaff_R15);
  abort();
}

Assistant:

static void
test_bson_as_json_double_nonfinite (void)
{
   size_t len;
   bson_t *b;
   char *str;
   char *expected;

   b = bson_new ();
   BSON_ASSERT (bson_append_double (b, "nan", -1, NAN));
   BSON_ASSERT (bson_append_double (b, "pos_inf", -1, INFINITY));
   BSON_ASSERT (bson_append_double (b, "neg_inf", -1, -INFINITY));
   str = bson_as_json (b, &len);

   expected = bson_strdup_printf ("{"
                                  " \"nan\" : %.20g,"
                                  " \"pos_inf\" : %.20g,"
                                  " \"neg_inf\" : %.20g }",
                                  NAN,
                                  INFINITY,
                                  -INFINITY);

   ASSERT_CMPSTR (str, expected);

   bson_free (expected);
   bson_free (str);
   bson_destroy (b);
}